

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateDescriptor.cpp
# Opt level: O3

void __thiscall
amrex::StateDescriptor::setUpMaps
          (StateDescriptor *this,int *use_default_map,InterpBase *default_map,int start_comp,
          int num_comp,InterpBase ***maps,int *nmaps,int **map_start_comp,int **map_num_comp,
          int **max_start_comp,int **min_end_comp)

{
  pointer ppIVar1;
  InterpBase *pIVar2;
  InterpBase **ppIVar3;
  int *piVar4;
  InterpBase *pIVar5;
  pointer piVar6;
  int iVar7;
  ulong uVar8;
  int *piVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  pointer piVar13;
  int *piVar14;
  InterpBase *pIVar15;
  
  *maps = (InterpBase **)0x0;
  *map_start_comp = (int *)0x0;
  *map_num_comp = (int *)0x0;
  *max_start_comp = (int *)0x0;
  *min_end_comp = (int *)0x0;
  ppIVar1 = (this->mapper_comp).
            super_vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>.
            super__Vector_base<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pIVar5 = ppIVar1[start_comp];
  *nmaps = 1;
  *use_default_map = 1;
  if (1 < num_comp) {
    if (pIVar5 == (InterpBase *)0x0) {
      pIVar5 = default_map;
    }
    lVar11 = (long)(start_comp + 1);
    do {
      pIVar2 = ppIVar1[lVar11];
      pIVar15 = default_map;
      if (pIVar2 != (InterpBase *)0x0) {
        *use_default_map = 0;
        pIVar15 = pIVar2;
      }
      if (pIVar5 != pIVar15) {
        *nmaps = *nmaps + 1;
        pIVar5 = pIVar15;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < num_comp + start_comp);
    if (*use_default_map == 0) {
      lVar11 = (long)*nmaps;
      uVar12 = lVar11 * 8;
      if (lVar11 < 0) {
        uVar12 = 0xffffffffffffffff;
      }
      uVar8 = lVar11 * 4;
      if (lVar11 < 0) {
        uVar8 = 0xffffffffffffffff;
      }
      ppIVar3 = (InterpBase **)operator_new__(uVar12);
      *maps = ppIVar3;
      piVar4 = (int *)operator_new__(uVar8);
      *map_start_comp = piVar4;
      piVar4 = (int *)operator_new__(uVar8);
      *map_num_comp = piVar4;
      piVar4 = (int *)operator_new__(uVar8);
      *min_end_comp = piVar4;
      piVar4 = (int *)operator_new__(uVar8);
      *max_start_comp = piVar4;
      pIVar5 = (this->mapper_comp).
               super_vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>.
               super__Vector_base<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>._M_impl
               .super__Vector_impl_data._M_start[start_comp];
      if (pIVar5 == (InterpBase *)0x0) {
        pIVar5 = default_map;
      }
      **maps = pIVar5;
      **map_start_comp = start_comp;
      piVar4 = *map_num_comp;
      *piVar4 = 1;
      piVar6 = (this->min_map_end_comp).super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      piVar9 = *min_end_comp;
      *piVar9 = piVar6[start_comp];
      piVar13 = (this->max_map_start_comp).super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      piVar14 = *max_start_comp;
      *piVar14 = piVar13[start_comp];
      if (1 < num_comp) {
        lVar11 = (long)(start_comp + 1);
        iVar10 = 0;
        do {
          pIVar5 = (this->mapper_comp).
                   super_vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>.
                   super__Vector_base<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar11];
          if (pIVar5 == (InterpBase *)0x0) {
            pIVar5 = default_map;
          }
          if ((*maps)[iVar10] == pIVar5) {
            piVar4[iVar10] = piVar4[iVar10] + 1;
            iVar7 = piVar6[lVar11];
            if (piVar6[lVar11] < piVar9[iVar10]) {
              iVar7 = piVar9[iVar10];
            }
            piVar9[iVar10] = iVar7;
            iVar7 = piVar14[iVar10];
            if (piVar13[lVar11] < piVar14[iVar10]) {
              iVar7 = piVar13[lVar11];
            }
            piVar14[iVar10] = iVar7;
          }
          else {
            (*maps)[(long)iVar10 + 1] = pIVar5;
            (*map_start_comp)[(long)iVar10 + 1] = (int)lVar11;
            piVar4 = *map_num_comp;
            piVar4[(long)iVar10 + 1] = 1;
            piVar6 = (this->min_map_end_comp).super_vector<int,_std::allocator<int>_>.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
            piVar9 = *min_end_comp;
            piVar9[(long)iVar10 + 1] = piVar6[lVar11];
            piVar13 = (this->max_map_start_comp).super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
            piVar14 = *max_start_comp;
            piVar14[(long)iVar10 + 1] = piVar13[lVar11];
            iVar10 = iVar10 + 1;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < num_comp + start_comp);
      }
    }
  }
  return;
}

Assistant:

void
StateDescriptor::setUpMaps (int&                use_default_map,
                            const InterpBase*   default_map,
                            int                 start_comp,
                            int                 num_comp,
                            InterpBase**&       maps,
                            int&                nmaps,
                            int*&               map_start_comp,
                            int*&               map_num_comp,
                            int*&               max_start_comp,
                            int*&               min_end_comp) const
{
    BL_ASSERT(start_comp>=0 && start_comp+num_comp-1 < ncomp && num_comp>0);

    maps           = 0;
    map_start_comp = 0;
    map_num_comp   = 0;
    max_start_comp = 0;
    min_end_comp   = 0;
    //
    // First, count number of interpolaters needed and allocate.
    //
    InterpBase* map = mapper_comp[start_comp];
    if (!map) map = (InterpBase*) default_map;
    nmaps = 1;
    int icomp = start_comp+1;

    use_default_map = 1;
    while (icomp < start_comp+num_comp)
    {
        InterpBase* mapper_icomp = mapper_comp[icomp];
        if (!mapper_icomp)
        {
            mapper_icomp = (InterpBase *) default_map;
        }
        else
        {
            use_default_map = 0;
        }
        if (map != mapper_icomp)
        {
            map = mapper_icomp;
            nmaps++;
        }
        icomp++;
    }

    if (use_default_map) return;

    maps           = new InterpBase*[nmaps];
    map_start_comp = new int[nmaps];
    map_num_comp   = new int[nmaps];
    min_end_comp   = new int[nmaps];
    max_start_comp = new int[nmaps];
    //
    // Now fill the slots.
    //
    int imap             = 0;

    if (mapper_comp[start_comp])
    {
        maps[imap] = mapper_comp[start_comp];
    }
    else
    {
        maps[imap] = (InterpBase *) default_map;
    }

    icomp                = start_comp+1;
    map_start_comp[imap] = start_comp;
    map_num_comp[imap]   = 1;
    min_end_comp[imap]   = min_map_end_comp[start_comp];
    max_start_comp[imap] = max_map_start_comp[start_comp];

    while (icomp < start_comp+num_comp)
    {
        InterpBase* mapper_icomp = mapper_comp[icomp];

        if (!mapper_icomp)
            mapper_icomp = (InterpBase *) default_map;

        if (maps[imap] != mapper_icomp)
        {
            imap++;

            BL_ASSERT (imap < nmaps);

            maps[imap]           = mapper_icomp;
            map_start_comp[imap] = icomp;
            map_num_comp[imap]   = 1;
            min_end_comp[imap]   = min_map_end_comp[icomp];
            max_start_comp[imap] = max_map_start_comp[icomp];

        }
        else
        {
            map_num_comp[imap]++;
            min_end_comp[imap]   = std::max(min_end_comp[imap],min_map_end_comp[icomp]);
            max_start_comp[imap] = std::min(max_start_comp[imap],max_map_start_comp[icomp]);
        }
        icomp++;
    }
}